

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

bool __thiscall
Inline::CanInlineBuiltInFunction
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlineeData,OpCode inlineCallOpCode,
          FunctionJITTimeInfo *inlinerData,BuiltinFunction builtInId,bool isCallApplyTarget)

{
  Opnd *pOVar1;
  StackSym *pSVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  ArgSlot AVar6;
  uint uVar7;
  BOOL BVar8;
  uint uVar9;
  uint uVar10;
  BuiltInFlags BVar11;
  JITTimeFunctionBody *pJVar12;
  JITTimeProfileInfo *this_00;
  FunctionJITTimeInfo *pFVar13;
  char16 *pcVar14;
  char16 *pcVar15;
  undefined4 *puVar16;
  char16 *pcVar17;
  size_t sVar18;
  undefined6 in_register_0000000a;
  char16_t *pcVar19;
  int iVar20;
  wchar local_a8 [4];
  char16 debugStringBuffer [42];
  
  iVar20 = (int)CONCAT62(in_register_0000000a,inlineCallOpCode);
  uVar7 = iVar20 - 0x25e;
  if ((uVar7 < 7) && ((0x43U >> (uVar7 & 0x1f) & 1) != 0)) {
    BVar8 = AutoSystemInfo::SSE4_1Available(&AutoSystemInfo::Data);
    if (BVar8 == 0) {
      pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
      uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
      pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
      uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar9,uVar10);
      if (!bVar4) {
        return false;
      }
      pcVar14 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
      pJVar12 = FunctionJITTimeInfo::GetBody(inlinerData);
      pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      pcVar19 = L"INLINING: Skip Inline: SSE4.1 not available\tInlinee: %s (#%d)\tCaller: %s\n";
LAB_005538ba:
      Output::Print(pcVar19,pcVar14,(ulong)builtInId._value,pcVar15);
      goto LAB_0055408a;
    }
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->topFunc->m_workItem);
    bVar4 = JITTimeFunctionBody::HasProfileInfo(pJVar12);
    if (bVar4) {
      pJVar12 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->topFunc->m_workItem);
      this_00 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar12);
      bVar4 = JITTimeProfileInfo::IsFloorInliningDisabled(this_00);
      if (bVar4) {
        pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
        uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
        pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
        uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar9,uVar10);
        if (!bVar4) {
          return false;
        }
        pcVar14 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
        pJVar12 = FunctionJITTimeInfo::GetBody(inlinerData);
        pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar12);
        pcVar19 = L"INLINING: Skip Inline: Floor Inlining Disabled\tInlinee: %s (#%d)\tCaller: %s\n"
        ;
        goto LAB_005538ba;
      }
    }
  }
  else if (iVar20 == 0) {
    return false;
  }
  if ((callInstr->m_src2 != (Opnd *)0x0) &&
     (OVar5 = IR::Opnd::GetKind(callInstr->m_src2), OVar5 == OpndKindSym)) {
    pOVar1 = callInstr->m_src2;
    OVar5 = IR::Opnd::GetKind(pOVar1);
    if (OVar5 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_005540a3;
      *puVar16 = 0;
    }
    pSVar2 = (StackSym *)pOVar1[1]._vptr_Opnd;
    if ((pSVar2->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar4) goto LAB_005540a3;
      *puVar16 = 0;
    }
    AVar6 = StackSym::GetArgSlotNum(pSVar2);
    if (0xf < AVar6) {
      pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
      uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
      pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
      uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar9,uVar10);
      if (!bVar4) {
        return false;
      }
      pcVar14 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
      pOVar1 = callInstr->m_src2;
      OVar5 = IR::Opnd::GetKind(pOVar1);
      if (OVar5 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar4) goto LAB_005540a3;
        *puVar16 = 0;
      }
      pSVar2 = (StackSym *)pOVar1[1]._vptr_Opnd;
      if ((pSVar2->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar4) goto LAB_005540a3;
        *puVar16 = 0;
      }
      AVar6 = StackSym::GetArgSlotNum(pSVar2);
      pJVar12 = FunctionJITTimeInfo::GetBody(inlinerData);
      pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_a8);
      Output::Print(L"INLINING: Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (#%d)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (#%d)\n"
                    ,pcVar14,(ulong)builtInId._value,(ulong)AVar6,0xf,pcVar15,pcVar17);
      goto LAB_0055408a;
    }
  }
  BVar11 = Js::JavascriptLibrary::GetFlagsForBuiltIn(builtInId);
  if (((BVar11 & BIF_TypeSpecAllToFloat) == BIF_None) ||
     (bVar4 = GlobOpt::DoFloatTypeSpec(this->topFunc), bVar4)) {
    if (((BVar11 & BIF_TypeSpecDstToFloat) == BIF_None) ||
       ((BVar8 = Js::JavascriptLibrary::CanFloatPreferenceFunc(builtInId),
        inlineCallOpCode == InlineArrayPop || (BVar8 != 0)))) {
      if (((BVar11 & BIF_TypeSpecAllToInt) == BIF_None) ||
         (bVar4 = GlobOpt::DoAggressiveIntTypeSpec(this->topFunc), bVar4)) {
        if (inlineCallOpCode == InlineMathClz) {
          bVar4 = GlobOpt::DoLossyIntTypeSpec(this->topFunc);
          if (bVar4) {
LAB_00553a05:
            if (callInstr->m_src1 == (Opnd *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar16 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0x95c,"(callInstr->GetSrc1())","callInstr->GetSrc1()");
              if (!bVar4) goto LAB_005540a3;
              *puVar16 = 0;
            }
            OVar5 = IR::Opnd::GetKind(callInstr->m_src1);
            if (OVar5 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar16 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0x95d,"(callInstr->GetSrc1()->IsRegOpnd())",
                                 "callInstr->GetSrc1()->IsRegOpnd()");
              if (!bVar4) goto LAB_005540a3;
              *puVar16 = 0;
            }
            pOVar1 = callInstr->m_src1;
            OVar5 = IR::Opnd::GetKind(pOVar1);
            if (OVar5 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar16 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar4) goto LAB_005540a3;
              *puVar16 = 0;
            }
            if (pOVar1[1]._vptr_Opnd == (_func_int **)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar16 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0x95e,"(callInstr->GetSrc1()->AsRegOpnd()->m_sym)",
                                 "callInstr->GetSrc1()->AsRegOpnd()->m_sym");
              if (!bVar4) goto LAB_005540a3;
              *puVar16 = 0;
            }
            if ((((BVar11 >> 0xe & 1) == 0) && (inlineCallOpCode != InlineArrayPop)) &&
               (callInstr->m_dst == (Opnd *)0x0)) {
              pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
              uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
              pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
              uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
              bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar9,uVar10);
              if (!bVar4) {
                return false;
              }
              pcVar14 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
              pJVar12 = FunctionJITTimeInfo::GetBody(inlinerData);
              pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar12);
              pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_a8)
              ;
              pcVar19 = 
              L"INLINING: Skip Inline: inlinee\'s return value is not assigned to anything\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
              ;
            }
            else {
              sVar18 = Js::JavascriptLibrary::GetArgCForBuiltIn(builtInId);
              pOVar1 = callInstr->m_src2;
              OVar5 = IR::Opnd::GetKind(pOVar1);
              if (OVar5 != OpndKindSym) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                *puVar16 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                   ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
                if (!bVar4) goto LAB_005540a3;
                *puVar16 = 0;
              }
              pSVar2 = (StackSym *)pOVar1[1]._vptr_Opnd;
              unique0x10001110 = sVar18;
              if ((pSVar2->super_Sym).m_kind != SymKindStack) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                *puVar16 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                   ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                if (!bVar4) goto LAB_005540a3;
                *puVar16 = 0;
              }
              AVar6 = StackSym::GetArgSlotNum(pSVar2);
              iVar20 = (((uint)AVar6 - (uint)isCallApplyTarget & 0xffff) - 1) +
                       (uint)((BVar11 >> 0xc & 1) != 0);
              if (iVar20 < 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                *puVar16 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                   ,0x973,"(inlineCallArgCount >= 0)","inlineCallArgCount >= 0");
                if (!bVar4) {
LAB_005540a3:
                  pcVar3 = (code *)invalidInstructionException();
                  (*pcVar3)();
                }
                *puVar16 = 0;
              }
              OVar5 = IR::Opnd::GetKind(pOVar1);
              if (OVar5 != OpndKindSym) {
                return true;
              }
              if ((BVar11 >> 0xd & 1) == 0) {
                if (stack0xffffffffffffffb0 == (long)iVar20) {
                  return true;
                }
                pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
                uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
                pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
                uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
                bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar9,uVar10);
                if (!bVar4) {
                  return false;
                }
                pcVar14 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
                pJVar12 = FunctionJITTimeInfo::GetBody(inlinerData);
                pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar12);
                pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet
                                    (inlinerData,(wchar (*) [42])local_a8);
                pcVar19 = 
                L"INLINING: Skip Inline: parameter count doesn\'t match dynamic profile\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
                ;
              }
              else {
                if ((long)iVar20 <= (long)stack0xffffffffffffffb0) {
                  return true;
                }
                pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
                uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
                pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
                uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
                bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar9,uVar10);
                if (!bVar4) {
                  return false;
                }
                pcVar14 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
                pJVar12 = FunctionJITTimeInfo::GetBody(inlinerData);
                pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar12);
                pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet
                                    (inlinerData,(wchar (*) [42])local_a8);
                pcVar19 = 
                L"INLINING: Skip Inline: parameter count exceeds the maximum number of parameters allowed\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
                ;
              }
            }
          }
          else {
            pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
            uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
            pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
            uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
            bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar9,uVar10);
            if (!bVar4) {
              return false;
            }
            pcVar14 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
            pJVar12 = FunctionJITTimeInfo::GetBody(inlinerData);
            pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar12);
            pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_a8);
            pcVar19 = 
            L"INLINING: Skip Inline: lossy int type spec is off, it\'s required for Math.clz32 to do | 0 on src opnds\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
            ;
          }
        }
        else if (inlineCallOpCode == InlineFunctionApply) {
          bVar4 = Func::GetHasStackArgs(callInstr->m_func);
          if (bVar4) {
            pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
            bVar4 = JITTimeFunctionBody::IsInlineApplyDisabled(pJVar12);
            if (!bVar4) goto LAB_00553a05;
          }
          pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
          uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
          pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
          uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
          bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar9,uVar10);
          if (!bVar4) {
            return false;
          }
          pcVar14 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
          pJVar12 = FunctionJITTimeInfo::GetBody(inlinerData);
          pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar12);
          pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_a8);
          pcVar19 = 
          L"INLINING: Skip Inline: stack args of inlining is off\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
          ;
        }
        else {
          if ((inlineCallOpCode != InlineMathImul) ||
             (bVar4 = GlobOpt::DoLossyIntTypeSpec(this->topFunc), bVar4)) goto LAB_00553a05;
          pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
          uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
          pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
          uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
          bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar9,uVar10);
          if (!bVar4) {
            return false;
          }
          pcVar14 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
          pJVar12 = FunctionJITTimeInfo::GetBody(inlinerData);
          pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar12);
          pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_a8);
          pcVar19 = 
          L"INLINING: Skip Inline: lossy int type spec is off, it\'s required for Math.imul to do | 0 on src opnds\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
          ;
        }
      }
      else {
        pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
        uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
        pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
        uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar9,uVar10);
        if (!bVar4) {
          return false;
        }
        pcVar14 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
        pJVar12 = FunctionJITTimeInfo::GetBody(inlinerData);
        pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar12);
        pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_a8);
        pcVar19 = 
        L"INLINING: Skip Inline: int type spec is off\tInlinee: %s (#%d)\tCaller: %s (%s)\n";
      }
    }
    else {
      pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
      uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
      pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
      uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar9,uVar10);
      if (!bVar4) {
        return false;
      }
      pcVar14 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
      pJVar12 = FunctionJITTimeInfo::GetBody(inlinerData);
      pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_a8);
      pcVar19 = 
      L"INLINING: Skip Inline: Cannot float-type-spec the inlinee\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
      ;
    }
  }
  else {
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
    uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
    uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar9,uVar10);
    if (!bVar4) {
      return false;
    }
    pcVar14 = Js::JavascriptLibrary::GetNameForBuiltIn(builtInId);
    pJVar12 = FunctionJITTimeInfo::GetBody(inlinerData);
    pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_a8);
    pcVar19 = L"INLINING: Skip Inline: float type spec is off\tInlinee: %s (#%d)\tCaller: %s (%s)\n"
    ;
  }
  Output::Print(pcVar19,pcVar14,(ulong)builtInId._value,pcVar15,pcVar17);
LAB_0055408a:
  Output::Flush();
  return false;
}

Assistant:

bool
Inline::CanInlineBuiltInFunction(IR::Instr *callInstr, const FunctionJITTimeInfo * inlineeData, Js::OpCode inlineCallOpCode, const FunctionJITTimeInfo * inlinerData, Js::BuiltinFunction builtInId, bool isCallApplyTarget)
{
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
    if (inlineCallOpCode == 0)
    {
        return false;
    }

    if (inlineCallOpCode == Js::OpCode::InlineMathFloor || inlineCallOpCode == Js::OpCode::InlineMathCeil || inlineCallOpCode == Js::OpCode::InlineMathRound)
    {
#if defined(_M_IX86) || defined(_M_X64)
        if (!AutoSystemInfo::Data.SSE4_1Available())
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: SSE4.1 not available\tInlinee: %s (#%d)\tCaller: %s\n"), Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId, inlinerData->GetBody()->GetDisplayName());
            return false;
        }
#endif
        if (callInstr->m_func->GetTopFunc()->HasProfileInfo() && callInstr->m_func->GetTopFunc()->GetReadOnlyProfileInfo()->IsFloorInliningDisabled())
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Floor Inlining Disabled\tInlinee: %s (#%d)\tCaller: %s\n"), Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId, inlinerData->GetBody()->GetDisplayName());
            return false;
        }
    }

    if (callInstr->GetSrc2() &&
        callInstr->GetSrc2()->IsSymOpnd() &&
        callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum() > Js::InlineeCallInfo::MaxInlineeArgoutCount)
    {
        // This is a hard limit as we only use 4 bits to encode the actual count in the InlineeCallInfo. Although
        // InliningDecider already checks for this, the check is against profile data that may not be accurate since profile
        // data matching does not take into account some types of changes to source code. Need to check this again with current
        // information.
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (#%d)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (#%d)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId, callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum(),
            Js::InlineeCallInfo::MaxInlineeArgoutCount, inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    Js::BuiltInFlags builtInFlags = Js::JavascriptLibrary::GetFlagsForBuiltIn(builtInId);

    bool isAnyArgFloat = (builtInFlags & Js::BuiltInFlags::BIF_TypeSpecAllToFloat) != 0;
    if (isAnyArgFloat && !GlobOpt::DoFloatTypeSpec(this->topFunc))
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: float type spec is off\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    bool canDstBeFloat = (builtInFlags & Js::BuiltInFlags::BIF_TypeSpecDstToFloat) != 0;
    if (canDstBeFloat && !Js::JavascriptLibrary::CanFloatPreferenceFunc(builtInId) && inlineCallOpCode != Js::OpCode::InlineArrayPop)
    {
        // Note that for Math.abs that means that even though it can potentially be type-spec'd to int, we won't inline it.
        // Some built-in functions, such as atan2, are disabled for float-pref.
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: Cannot float-type-spec the inlinee\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId, // Get the _value (cause operator _E) to avoid using struct directly.
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    bool isAnyArgInt = (builtInFlags & (Js::BuiltInFlags::BIF_TypeSpecDstToInt | Js::BuiltInFlags::BIF_TypeSpecSrc1ToInt | Js::BuiltInFlags::BIF_TypeSpecSrc2ToInt)) != 0;
    if (isAnyArgInt && !GlobOpt::DoAggressiveIntTypeSpec(this->topFunc))
    {
        // Note that for Math.abs that means that even though it can potentially be type-spec'd to float, we won't inline it.
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: int type spec is off\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    if (inlineCallOpCode == Js::OpCode::InlineMathImul && !GlobOpt::DoLossyIntTypeSpec(topFunc))
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: lossy int type spec is off, it's required for Math.imul to do | 0 on src opnds\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    if (inlineCallOpCode == Js::OpCode::InlineMathClz && !GlobOpt::DoLossyIntTypeSpec(topFunc))
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: lossy int type spec is off, it's required for Math.clz32 to do | 0 on src opnds\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    if (inlineCallOpCode == Js::OpCode::InlineFunctionApply && (!callInstr->m_func->GetHasStackArgs() || this->topFunc->GetJITFunctionBody()->IsInlineApplyDisabled()))
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: stack args of inlining is off\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    // TODO: when adding support for other type spec args (array, string) do appropriate check as well.

    Assert(callInstr->GetSrc1());
    Assert(callInstr->GetSrc1()->IsRegOpnd());
    Assert(callInstr->GetSrc1()->AsRegOpnd()->m_sym);

    if (!(builtInFlags & Js::BuiltInFlags::BIF_IgnoreDst) && callInstr->GetDst() == nullptr && inlineCallOpCode != Js::OpCode::InlineArrayPop)
    {
        // Is seems that it's not worth optimizing odd cases where the result is unused.
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: inlinee's return value is not assigned to anything\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
            Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
            inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    // Number of arguments, not including "this".
    IntConstType requiredInlineCallArgCount = (IntConstType)Js::JavascriptLibrary::GetArgCForBuiltIn(builtInId);

    IR::Opnd* linkOpnd = callInstr->GetSrc2();
    Js::ArgSlot actualCount = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum() - (isCallApplyTarget ? 1 : 0);

    // Check for missing actuals:
    // if number of passed params to built-in function is not what it needs, don't inline.
    bool usesThisArgument = (builtInFlags & Js::BuiltInFlags::BIF_UseSrc0) != 0;
    int inlineCallArgCount = (int)(usesThisArgument ? actualCount : actualCount - 1);
    Assert(inlineCallArgCount >= 0);

    if (linkOpnd->IsSymOpnd())
    {
        if ((builtInFlags & Js::BuiltInFlags::BIF_VariableArgsNumber) != 0)
        {
            if (inlineCallArgCount > requiredInlineCallArgCount)
            {
                INLINE_TESTTRACE(_u("INLINING: Skip Inline: parameter count exceeds the maximum number of parameters allowed\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
                    Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
                return false;
            }
        }
        else if (inlineCallArgCount != requiredInlineCallArgCount)
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: parameter count doesn't match dynamic profile\tInlinee: %s (#%d)\tCaller: %s (%s)\n"),
                Js::JavascriptLibrary::GetNameForBuiltIn(builtInId), (int)builtInId,
                inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
            return false;
        }
    }

    return true;
}